

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_ctype.c
# Opt level: O0

GCstr * lj_ctype_repr_int64(lua_State *L,uint64_t n,int isunsigned)

{
  undefined1 auVar1 [16];
  undefined1 *puVar2;
  GCstr *pGVar3;
  int in_EDX;
  ulong in_RSI;
  bool bVar4;
  int sign;
  char *p;
  char buf [24];
  char *in_stack_00000028;
  undefined4 in_stack_00000030;
  undefined1 *local_40;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  ulong local_10;
  
  bVar4 = false;
  local_21 = 0x4c;
  local_22 = 0x4c;
  local_10 = in_RSI;
  if (in_EDX == 0) {
    bVar4 = (long)in_RSI < 0;
    puVar2 = &local_22;
    if (bVar4) {
      local_10 = (in_RSI ^ 0xffffffffffffffff) + 1;
    }
  }
  else {
    local_23 = 0x55;
    puVar2 = &local_23;
  }
  do {
    local_40 = puVar2;
    auVar1._8_8_ = 0;
    auVar1._0_8_ = local_10;
    local_40[-1] = SUB161(auVar1 % ZEXT816(10),0) + '0';
    local_10 = local_10 / 10;
    puVar2 = local_40 + -1;
  } while (local_10 != 0);
  if (bVar4) {
    local_40[-2] = 0x2d;
  }
  pGVar3 = lj_str_new((lua_State *)CONCAT44(isunsigned,in_stack_00000030),in_stack_00000028,
                      buf._16_8_);
  return pGVar3;
}

Assistant:

GCstr *lj_ctype_repr_int64(lua_State *L, uint64_t n, int isunsigned)
{
  char buf[1+20+3];
  char *p = buf+sizeof(buf);
  int sign = 0;
  *--p = 'L'; *--p = 'L';
  if (isunsigned) {
    *--p = 'U';
  } else if ((int64_t)n < 0) {
    n = ~n+1u;
    sign = 1;
  }
  do { *--p = (char)('0' + n % 10); } while (n /= 10);
  if (sign) *--p = '-';
  return lj_str_new(L, p, (size_t)(buf+sizeof(buf)-p));
}